

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

void fallbackSort(UInt32 *fmap,UInt32 *eclass,UInt32 *bhtab,Int32 nblock,Int32 verb)

{
  UInt32 UVar1;
  int iVar2;
  UChar *eclass8;
  Int32 nBhtab;
  Int32 nNotDone;
  Int32 cc1;
  Int32 cc;
  Int32 r;
  Int32 l;
  Int32 k;
  Int32 j;
  Int32 i;
  Int32 H;
  Int32 ftabCopy [256];
  Int32 ftab [257];
  Int32 verb_local;
  Int32 nblock_local;
  UInt32 *bhtab_local;
  UInt32 *eclass_local;
  UInt32 *fmap_local;
  
  if (3 < verb) {
    fprintf(_stderr,"        bucket sorting ...\n");
  }
  for (k = 0; k < 0x101; k = k + 1) {
    ftabCopy[(long)k + 0xfe] = 0;
  }
  for (k = 0; k < nblock; k = k + 1) {
    ftabCopy[(ulong)*(byte *)((long)eclass + (long)k) + 0xfe] =
         ftabCopy[(ulong)*(byte *)((long)eclass + (long)k) + 0xfe] + 1;
  }
  for (k = 0; k < 0x100; k = k + 1) {
    (&i)[k] = ftabCopy[(long)k + 0xfe];
  }
  for (k = 1; k < 0x101; k = k + 1) {
    ftabCopy[(long)k + 0xfe] = ftabCopy[(long)(k + -1) + 0xfe] + ftabCopy[(long)k + 0xfe];
  }
  for (k = 0; k < nblock; k = k + 1) {
    iVar2 = ftabCopy[(long)(int)(uint)*(byte *)((long)eclass + (long)k) + 0xfe];
    ftabCopy[(long)(int)(uint)*(byte *)((long)eclass + (long)k) + 0xfe] = iVar2 + -1;
    fmap[iVar2 + -1] = k;
  }
  for (k = 0; k < nblock / 0x20 + 2; k = k + 1) {
    bhtab[k] = 0;
  }
  for (k = 0; k < 0x100; k = k + 1) {
    bhtab[ftabCopy[(long)k + 0xfe] >> 5] =
         1 << ((byte)ftabCopy[(long)k + 0xfe] & 0x1f) | bhtab[ftabCopy[(long)k + 0xfe] >> 5];
  }
  for (k = 0; k < 0x20; k = k + 1) {
    iVar2 = nblock + k * 2 >> 5;
    bhtab[iVar2] = 1 << ((char)nblock + (char)(k << 1) & 0x1fU) | bhtab[iVar2];
    iVar2 = nblock + k * 2 + 1 >> 5;
    bhtab[iVar2] = (1 << ((char)nblock + (char)(k << 1) + 1U & 0x1f) ^ 0xffffffffU) & bhtab[iVar2];
  }
  j = 1;
  do {
    if (3 < verb) {
      fprintf(_stderr,"        depth %6d has ",(ulong)(uint)j);
    }
    l = 0;
    for (k = 0; k < nblock; k = k + 1) {
      if ((bhtab[k >> 5] & 1 << ((byte)k & 0x1f)) != 0) {
        l = k;
      }
      r = fmap[k] - j;
      if (r < 0) {
        r = nblock + r;
      }
      eclass[r] = l;
    }
    eclass8._4_4_ = 0;
    cc1 = -1;
    while( true ) {
      do {
        r = cc1 + 1;
        cc1 = r;
      } while ((bhtab[r >> 5] & 1 << ((byte)r & 0x1f)) != 0 && (r & 0x1fU) != 0);
      if ((bhtab[r >> 5] & 1 << ((byte)r & 0x1f)) != 0) {
        while (bhtab[r >> 5] == 0xffffffff) {
          r = r + 0x20;
        }
        while ((bhtab[r >> 5] & 1 << ((byte)r & 0x1f)) != 0) {
          r = r + 1;
        }
      }
      k = r + -1;
      if (nblock <= k) break;
      while( true ) {
        if ((bhtab[r >> 5] & 1 << ((byte)r & 0x1f)) != 0 || (r & 0x1fU) == 0) break;
        r = r + 1;
      }
      if ((bhtab[r >> 5] & 1 << ((byte)r & 0x1f)) == 0) {
        while (bhtab[r >> 5] == 0) {
          r = r + 0x20;
        }
        while ((bhtab[r >> 5] & 1 << ((byte)r & 0x1f)) == 0) {
          r = r + 1;
        }
      }
      cc1 = r + -1;
      if (nblock <= cc1) break;
      if (k < cc1) {
        eclass8._4_4_ = (cc1 - k) + 1 + eclass8._4_4_;
        fallbackQSort3(fmap,eclass,k,cc1);
        nNotDone = -1;
        for (; k <= cc1; k = k + 1) {
          UVar1 = eclass[fmap[k]];
          if (nNotDone != UVar1) {
            bhtab[k >> 5] = 1 << ((byte)k & 0x1f) | bhtab[k >> 5];
            nNotDone = UVar1;
          }
        }
      }
    }
    if (3 < verb) {
      fprintf(_stderr,"%6d unresolved strings\n",(ulong)eclass8._4_4_);
    }
    j = j << 1;
    if ((nblock < j) || (eclass8._4_4_ == 0)) {
      if (3 < verb) {
        fprintf(_stderr,"        reconstructing block ...\n");
      }
      l = 0;
      for (k = 0; k < nblock; k = k + 1) {
        for (; (&i)[l] == 0; l = l + 1) {
        }
        (&i)[l] = (&i)[l] + -1;
        *(char *)((long)eclass + (ulong)fmap[k]) = (char)l;
      }
      if (0xff < l) {
        BZ2_bz__AssertH__fail(0x3ed);
      }
      return;
    }
  } while( true );
}

Assistant:

static
void fallbackSort ( UInt32* fmap, 
                    UInt32* eclass, 
                    UInt32* bhtab,
                    Int32   nblock,
                    Int32   verb )
{
   Int32 ftab[257];
   Int32 ftabCopy[256];
   Int32 H, i, j, k, l, r, cc, cc1;
   Int32 nNotDone;
   Int32 nBhtab;
   UChar* eclass8 = (UChar*)eclass;

   /*--
      Initial 1-char radix sort to generate
      initial fmap and initial BH bits.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        bucket sorting ...\n" );
   for (i = 0; i < 257;    i++) ftab[i] = 0;
   for (i = 0; i < nblock; i++) ftab[eclass8[i]]++;
   for (i = 0; i < 256;    i++) ftabCopy[i] = ftab[i];
   for (i = 1; i < 257;    i++) ftab[i] += ftab[i-1];

   for (i = 0; i < nblock; i++) {
      j = eclass8[i];
      k = ftab[j] - 1;
      ftab[j] = k;
      fmap[k] = i;
   }

   nBhtab = 2 + (nblock / 32);
   for (i = 0; i < nBhtab; i++) bhtab[i] = 0;
   for (i = 0; i < 256; i++) SET_BH(ftab[i]);

   /*--
      Inductively refine the buckets.  Kind-of an
      "exponential radix sort" (!), inspired by the
      Manber-Myers suffix array construction algorithm.
   --*/

   /*-- set sentinel bits for block-end detection --*/
   for (i = 0; i < 32; i++) { 
      SET_BH(nblock + 2*i);
      CLEAR_BH(nblock + 2*i + 1);
   }

   /*-- the log(N) loop --*/
   H = 1;
   while (1) {

      if (verb >= 4) 
         VPrintf1 ( "        depth %6d has ", H );

      j = 0;
      for (i = 0; i < nblock; i++) {
         if (ISSET_BH(i)) j = i;
         k = fmap[i] - H; if (k < 0) k += nblock;
         eclass[k] = j;
      }

      nNotDone = 0;
      r = -1;
      while (1) {

	 /*-- find the next non-singleton bucket --*/
         k = r + 1;
         while (ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (ISSET_BH(k)) {
            while (WORD_BH(k) == 0xffffffff) k += 32;
            while (ISSET_BH(k)) k++;
         }
         l = k - 1;
         if (l >= nblock) break;
         while (!ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (!ISSET_BH(k)) {
            while (WORD_BH(k) == 0x00000000) k += 32;
            while (!ISSET_BH(k)) k++;
         }
         r = k - 1;
         if (r >= nblock) break;

         /*-- now [l, r] bracket current bucket --*/
         if (r > l) {
            nNotDone += (r - l + 1);
            fallbackQSort3 ( fmap, eclass, l, r );

            /*-- scan bucket and generate header bits-- */
            cc = -1;
            for (i = l; i <= r; i++) {
               cc1 = eclass[fmap[i]];
               if (cc != cc1) { SET_BH(i); cc = cc1; };
            }
         }
      }

      if (verb >= 4) 
         VPrintf1 ( "%6d unresolved strings\n", nNotDone );

      H *= 2;
      if (H > nblock || nNotDone == 0) break;
   }

   /*-- 
      Reconstruct the original block in
      eclass8 [0 .. nblock-1], since the
      previous phase destroyed it.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        reconstructing block ...\n" );
   j = 0;
   for (i = 0; i < nblock; i++) {
      while (ftabCopy[j] == 0) j++;
      ftabCopy[j]--;
      eclass8[fmap[i]] = (UChar)j;
   }
   AssertH ( j < 256, 1005 );
}